

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerBailOnNotString(Lowerer *this,Instr *instr)

{
  OpCode opcode;
  bool bVar1;
  Opnd *pOVar2;
  Opnd *src1Opnd;
  Instr *instr_00;
  LabelInstr *continueLabel;
  LabelInstr *labelHelper;
  RegOpnd *local_60;
  RegOpnd *srcReg;
  LabelInstr *helperLabelInstr;
  LabelInstr *continueLabelInstr;
  Instr *movInstr;
  Instr *local_18;
  Instr *instr_local;
  Lowerer *this_local;
  
  local_18 = instr;
  instr_local = (Instr *)this;
  pOVar2 = IR::Instr::GetSrc1(instr);
  movInstr._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(pOVar2);
  bVar1 = ValueType::IsString((ValueType *)((long)&movInstr + 6));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    IR::Instr::ClearBailOutInfo(local_18);
  }
  else {
    opcode = local_18->m_opcode;
    pOVar2 = IR::Instr::UnlinkDst(local_18);
    src1Opnd = IR::Instr::UnlinkSrc1(local_18);
    instr_00 = IR::Instr::New(opcode,pOVar2,src1Opnd,local_18->m_func);
    IR::Instr::InsertBefore(local_18,instr_00);
    continueLabel = IR::LabelInstr::New(Label,this->m_func,false);
    labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertAfter(local_18,&continueLabel->super_Instr);
    pOVar2 = IR::Instr::GetSrc1(instr_00);
    bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
    if (bVar1) {
      pOVar2 = IR::Instr::GetSrc1(instr_00);
      local_60 = IR::Opnd::AsRegOpnd(pOVar2);
    }
    else {
      local_60 = (RegOpnd *)0x0;
    }
    GenerateStringTest(this,local_60,local_18,labelHelper,continueLabel,true);
    GenerateBailOut(this,local_18,(BranchInstr *)0x0,labelHelper,(LabelInstr *)0x0);
  }
  return;
}

Assistant:

void Lowerer::LowerBailOnNotString(IR::Instr *instr)
{
    if (!instr->GetSrc1()->GetValueType().IsString())
    {
        /*Creating a MOV instruction*/
        IR::Instr * movInstr = IR::Instr::New(instr->m_opcode, instr->UnlinkDst(), instr->UnlinkSrc1(), instr->m_func);
        instr->InsertBefore(movInstr);

        IR::LabelInstr *continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        IR::LabelInstr *helperLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        instr->InsertAfter(continueLabelInstr);

        IR::RegOpnd *srcReg = movInstr->GetSrc1()->IsRegOpnd() ? movInstr->GetSrc1()->AsRegOpnd() : nullptr;

        this->GenerateStringTest(srcReg, instr, helperLabelInstr, continueLabelInstr);
        this->GenerateBailOut(instr, nullptr, helperLabelInstr);
    }
    else
    {
        instr->ClearBailOutInfo();
    }
}